

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O2

int LogL16Encode(TIFF *tif,uint8_t *bp,tmsize_t cc,uint16_t s)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  undefined6 in_register_0000000a;
  long lVar5;
  long lVar6;
  uint8_t *puVar7;
  int iVar8;
  uint8_t *puVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  ulong local_48;
  
  if ((int)CONCAT62(in_register_0000000a,s) != 0) {
    __assert_fail("s == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_luv.c"
                  ,0x1bf,"int LogL16Encode(TIFF *, uint8_t *, tmsize_t, uint16_t)");
  }
  puVar7 = tif->tif_data;
  if (puVar7 == (uint8_t *)0x0) {
    __assert_fail("sp != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_luv.c"
                  ,0x1c0,"int LogL16Encode(TIFF *, uint8_t *, tmsize_t, uint16_t)");
  }
  lVar3 = cc / (long)*(int *)(puVar7 + 0xc);
  puVar9 = bp;
  if (*(int *)(puVar7 + 4) != 1) {
    if (*(long *)(puVar7 + 0x18) < lVar3) {
      TIFFErrorExtR(tif,"LogL16Encode","Translation buffer too short");
      return 0;
    }
    puVar9 = *(uint8_t **)(puVar7 + 0x10);
    (**(code **)(puVar7 + 0x20))(puVar7,bp,lVar3);
  }
  puVar7 = tif->tif_rawcp;
  lVar4 = tif->tif_rawdatasize - tif->tif_rawcc;
  local_48 = 0;
  iVar8 = 8;
  do {
    if (iVar8 < 0) {
      tif->tif_rawcp = puVar7;
      tif->tif_rawcc = tif->tif_rawdatasize - lVar4;
      return 1;
    }
    bVar1 = (byte)iVar8;
    uVar13 = 0xff << (bVar1 & 0x1f);
    for (lVar14 = 0; lVar14 < lVar3; lVar14 = lVar14 + local_48) {
      lVar6 = lVar14;
      if (lVar4 < 4) {
        tif->tif_rawcp = puVar7;
        tif->tif_rawcc = tif->tif_rawdatasize - lVar4;
        iVar2 = TIFFFlushData1(tif);
        if (iVar2 == 0) {
          return 0;
        }
        puVar7 = tif->tif_rawcp;
        lVar4 = tif->tif_rawdatasize - tif->tif_rawcc;
      }
      while( true ) {
        lVar5 = lVar6;
        if (lVar3 <= lVar5) break;
        local_48 = (ulong)(uint)((int)lVar3 - (int)lVar5);
        uVar10 = 1;
        while( true ) {
          if (uVar10 == 0x81) {
            local_48 = 0x81;
            goto LAB_002641c2;
          }
          if (lVar3 <= (long)(lVar5 + uVar10)) goto LAB_002641a7;
          if (((int)(short)*(ushort *)((long)(puVar9 + lVar5 * 2) + uVar10 * 2) & uVar13) !=
              (int)(short)(*(ushort *)(puVar9 + lVar5 * 2) & (ushort)uVar13)) break;
          uVar10 = uVar10 + 1;
        }
        local_48 = uVar10 & 0xffffffff;
LAB_002641a7:
        lVar6 = local_48 + lVar5;
        if (3 < (uint)local_48) break;
      }
LAB_002641c2:
      if ((lVar5 - lVar14 & 0xfffffffffffffffeU) == 2) {
        uVar11 = (uint)(short)(*(ushort *)(puVar9 + lVar14 * 2) & (ushort)uVar13);
        lVar6 = lVar14 + 1;
        do {
          if (((int)*(short *)(puVar9 + lVar6 * 2) & uVar13) != uVar11) goto LAB_002642ae;
          lVar6 = lVar6 + 1;
        } while (lVar5 != lVar6);
        *puVar7 = ~(byte)lVar14 + (char)lVar5 + '\x7f';
        puVar7[1] = (uint8_t)(uVar11 >> (bVar1 & 0x1f));
        puVar7 = puVar7 + 2;
        lVar4 = lVar4 + -2;
        lVar14 = lVar5;
      }
LAB_002642ae:
      for (; uVar10 = lVar5 - lVar14, uVar10 != 0 && lVar14 <= lVar5; lVar14 = lVar14 + uVar12) {
        if (0x7e < (long)uVar10) {
          uVar10 = 0x7f;
        }
        if (lVar4 < (long)(uVar10 + 3)) {
          tif->tif_rawcp = puVar7;
          tif->tif_rawcc = tif->tif_rawdatasize - lVar4;
          iVar2 = TIFFFlushData1(tif);
          if (iVar2 == 0) {
            return 0;
          }
          puVar7 = tif->tif_rawcp;
          lVar4 = tif->tif_rawdatasize - tif->tif_rawcc;
        }
        *puVar7 = (uint8_t)uVar10;
        for (uVar12 = 0; uVar10 != uVar12; uVar12 = uVar12 + 1) {
          puVar7[uVar12 + 1] =
               (uint8_t)((int)*(short *)(puVar9 + uVar12 * 2 + lVar14 * 2) >> (bVar1 & 0x1f));
        }
        puVar7 = puVar7 + uVar12 + 1;
        lVar4 = lVar4 + ~uVar12;
      }
      if ((int)local_48 < 4) {
        local_48 = 0;
      }
      else {
        *puVar7 = (char)local_48 + '~';
        puVar7[1] = (uint8_t)((int)*(short *)(puVar9 + lVar5 * 2) >> (bVar1 & 0x1f));
        puVar7 = puVar7 + 2;
        lVar4 = lVar4 + -2;
      }
    }
    iVar8 = iVar8 + -8;
  } while( true );
}

Assistant:

static int LogL16Encode(TIFF *tif, uint8_t *bp, tmsize_t cc, uint16_t s)
{
    static const char module[] = "LogL16Encode";
    LogLuvState *sp = EncoderState(tif);
    int shft;
    tmsize_t i;
    tmsize_t j;
    tmsize_t npixels;
    uint8_t *op;
    int16_t *tp;
    int16_t b;
    tmsize_t occ;
    int rc = 0, mask;
    tmsize_t beg;

    (void)s;
    assert(s == 0);
    assert(sp != NULL);
    npixels = cc / sp->pixel_size;

    if (sp->user_datafmt == SGILOGDATAFMT_16BIT)
        tp = (int16_t *)bp;
    else
    {
        tp = (int16_t *)sp->tbuf;
        if (sp->tbuflen < npixels)
        {
            TIFFErrorExtR(tif, module, "Translation buffer too short");
            return (0);
        }
        (*sp->tfunc)(sp, bp, npixels);
    }
    /* compress each byte string */
    op = tif->tif_rawcp;
    occ = tif->tif_rawdatasize - tif->tif_rawcc;
    for (shft = 8; shft >= 0; shft -= 8)
    {
        for (i = 0; i < npixels; i += rc)
        {
            if (occ < 4)
            {
                tif->tif_rawcp = op;
                tif->tif_rawcc = tif->tif_rawdatasize - occ;
                if (!TIFFFlushData1(tif))
                    return (0);
                op = tif->tif_rawcp;
                occ = tif->tif_rawdatasize - tif->tif_rawcc;
            }
            mask = 0xff << shft; /* find next run */
            for (beg = i; beg < npixels; beg += rc)
            {
                b = (int16_t)(tp[beg] & mask);
                rc = 1;
                while (rc < 127 + 2 && beg + rc < npixels &&
                       (tp[beg + rc] & mask) == b)
                    rc++;
                if (rc >= MINRUN)
                    break; /* long enough */
            }
            if (beg - i > 1 && beg - i < MINRUN)
            {
                b = (int16_t)(tp[i] & mask); /*check short run */
                j = i + 1;
                while ((tp[j++] & mask) == b)
                    if (j == beg)
                    {
                        *op++ = (uint8_t)(128 - 2 + j - i);
                        *op++ = (uint8_t)(b >> shft);
                        occ -= 2;
                        i = beg;
                        break;
                    }
            }
            while (i < beg)
            { /* write out non-run */
                if ((j = beg - i) > 127)
                    j = 127;
                if (occ < j + 3)
                {
                    tif->tif_rawcp = op;
                    tif->tif_rawcc = tif->tif_rawdatasize - occ;
                    if (!TIFFFlushData1(tif))
                        return (0);
                    op = tif->tif_rawcp;
                    occ = tif->tif_rawdatasize - tif->tif_rawcc;
                }
                *op++ = (uint8_t)j;
                occ--;
                while (j--)
                {
                    *op++ = (uint8_t)(tp[i++] >> shft & 0xff);
                    occ--;
                }
            }
            if (rc >= MINRUN)
            { /* write out run */
                *op++ = (uint8_t)(128 - 2 + rc);
                *op++ = (uint8_t)(tp[beg] >> shft & 0xff);
                occ -= 2;
            }
            else
                rc = 0;
        }
    }
    tif->tif_rawcp = op;
    tif->tif_rawcc = tif->tif_rawdatasize - occ;

    return (1);
}